

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void vkt::shaderexecutor::addScalarFactory<vkt::shaderexecutor::Functions::Sinh>
               (BuiltinFuncs *funcs,string *name)

{
  Sinh *pSVar1;
  GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this;
  SharedPtr<const_vkt::shaderexecutor::CaseFactory> SStack_48;
  GenFuncs<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_38;
  
  if (name->_M_string_length == 0) {
    pSVar1 = instance<vkt::shaderexecutor::Functions::Sinh>();
    (*(pSVar1->
      super_DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ).
      super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      .super_FuncBase._vptr_FuncBase[2])(&local_38,pSVar1);
    std::__cxx11::string::operator=((string *)name,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  this = (GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *)operator_new(0x48);
  makeVectorizedFuncs<vkt::shaderexecutor::Functions::Sinh>();
  GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::GenFuncCaseFactory(this,&local_38,name);
  de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>::SharedPtr(&SStack_48,(CaseFactory *)this);
  std::
  vector<de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>,_std::allocator<de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>_>_>
  ::push_back(&funcs->m_factories,&SStack_48);
  de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>::release(&SStack_48);
  return;
}

Assistant:

void addScalarFactory(BuiltinFuncs& funcs, string name = "")
{
	if (name.empty())
		name = instance<F>().getName();

	funcs.addFactory(SharedPtr<const CaseFactory>(new GenFuncCaseFactory<typename F::Sig>(makeVectorizedFuncs<F>(), name)));
}